

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O1

void __thiscall KeyValueFile::errorParam(KeyValueFile *this,char *msg,char *key_name)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  string err;
  allocator<char> local_131;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->printErrorFunc == (PrintErrorFunc)0x0) {
    return;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ERROR: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  local_d0 = &local_c0;
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar1[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->fileName)._M_dataplus._M_p);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_100 = *puVar4;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar4;
    local_110 = (ulong *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,key_name,&local_131);
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_e8 + local_108)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if ((ulong)(local_e8 + local_108) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
      goto LAB_00129f8f;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
LAB_00129f8f:
  local_130 = &local_120;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_120 = *plVar1;
    uStack_118 = puVar2[3];
  }
  else {
    local_120 = *plVar1;
    local_130 = (long *)*puVar2;
  }
  local_128 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (*this->printErrorFunc)((char *)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  return;
}

Assistant:

void errorParam(const char * msg, const char * key_name) const
  {
    if (printErrorFunc)
    {
      std::string err = std::string("ERROR: ") + msg + ", at file '" + fileName +  "', key '" + std::string(key_name) + "'\n";
      printErrorFunc(err.c_str());
    }
  }